

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FileOptions::MergeFrom(FileOptions *this,FileOptions *from)

{
  bool bVar1;
  uint uVar2;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x133d);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             &(from->uninterpreted_option_).super_RepeatedPtrFieldBase);
  uVar2 = from->_has_bits_[0];
  if ((char)uVar2 != '\0') {
    if ((uVar2 & 1) != 0) {
      set_java_package(this,from->java_package_);
      uVar2 = from->_has_bits_[0];
    }
    if ((uVar2 & 2) != 0) {
      set_java_outer_classname(this,from->java_outer_classname_);
      uVar2 = from->_has_bits_[0];
    }
    if ((uVar2 & 4) != 0) {
      bVar1 = from->java_multiple_files_;
      this->_has_bits_[0] = this->_has_bits_[0] | 4;
      this->java_multiple_files_ = bVar1;
      uVar2 = from->_has_bits_[0];
    }
    if ((uVar2 & 8) != 0) {
      bVar1 = from->java_generate_equals_and_hash_;
      this->_has_bits_[0] = this->_has_bits_[0] | 8;
      this->java_generate_equals_and_hash_ = bVar1;
      uVar2 = from->_has_bits_[0];
    }
    if ((uVar2 & 0x10) != 0) {
      set_optimize_for(this,from->optimize_for_);
      uVar2 = from->_has_bits_[0];
    }
    if ((uVar2 & 0x20) != 0) {
      set_go_package(this,from->go_package_);
      uVar2 = from->_has_bits_[0];
    }
    if ((uVar2 & 0x40) != 0) {
      bVar1 = from->cc_generic_services_;
      this->_has_bits_[0] = this->_has_bits_[0] | 0x40;
      this->cc_generic_services_ = bVar1;
      uVar2 = from->_has_bits_[0];
    }
    if ((char)uVar2 < '\0') {
      bVar1 = from->java_generic_services_;
      this->_has_bits_[0] = this->_has_bits_[0] | 0x80;
      this->java_generic_services_ = bVar1;
      uVar2 = from->_has_bits_[0];
    }
  }
  if ((uVar2 >> 8 & 1) != 0) {
    bVar1 = from->py_generic_services_;
    this->_has_bits_[0] = this->_has_bits_[0] | 0x100;
    this->py_generic_services_ = bVar1;
  }
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void FileOptions::MergeFrom(const FileOptions& from) {
  GOOGLE_CHECK_NE(&from, this);
  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_java_package()) {
      set_java_package(from.java_package());
    }
    if (from.has_java_outer_classname()) {
      set_java_outer_classname(from.java_outer_classname());
    }
    if (from.has_java_multiple_files()) {
      set_java_multiple_files(from.java_multiple_files());
    }
    if (from.has_java_generate_equals_and_hash()) {
      set_java_generate_equals_and_hash(from.java_generate_equals_and_hash());
    }
    if (from.has_optimize_for()) {
      set_optimize_for(from.optimize_for());
    }
    if (from.has_go_package()) {
      set_go_package(from.go_package());
    }
    if (from.has_cc_generic_services()) {
      set_cc_generic_services(from.cc_generic_services());
    }
    if (from.has_java_generic_services()) {
      set_java_generic_services(from.java_generic_services());
    }
  }
  if (from._has_bits_[8 / 32] & (0xffu << (8 % 32))) {
    if (from.has_py_generic_services()) {
      set_py_generic_services(from.py_generic_services());
    }
  }
  _extensions_.MergeFrom(from._extensions_);
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}